

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<Fad<double>_>::AddKel
          (TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *elmat,TPZVec<long> *source,
          TPZVec<long> *destinationindex)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  double *pdVar13;
  bool bVar14;
  Fad<double> prevval;
  Fad<double> local_a0;
  TPZVec<long> *local_80;
  TPZVec<long> *local_78;
  TPZMatrix<Fad<double>_> *local_70;
  long local_68;
  long local_60;
  long local_58;
  Fad<double> local_50;
  
  lVar2 = source->fNElements;
  local_80 = source;
  local_78 = destinationindex;
  Fad<double>::Fad(&local_a0);
  local_70 = this;
  iVar7 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])(this);
  if (iVar7 == 0) {
    if (0 < lVar2) {
      lVar9 = 0;
      do {
        lVar3 = local_78->fStore[lVar9];
        local_58 = local_80->fStore[lVar9];
        local_60 = local_58 << 5;
        lVar10 = 0;
        local_68 = lVar9;
        do {
          lVar9 = local_78->fStore[lVar10];
          lVar4 = local_80->fStore[lVar10];
          (*(local_70->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_50,local_70,lVar3);
          local_a0.val_ = local_50.val_;
          Vector<double>::operator=(&local_a0.dx_,&local_50.dx_);
          lVar6 = local_58;
          bVar14 = local_58 < 0;
          local_a0.defaultVal = local_50.defaultVal;
          Fad<double>::~Fad(&local_50);
          lVar12 = (elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
          if (((lVar12 <= lVar6 || bVar14) || (lVar4 < 0)) ||
             ((elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= lVar4)) {
            TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar12 = lVar12 * lVar4;
          uVar1 = *(uint *)((long)&elmat->fElem[lVar12].dx_.num_elts + local_60);
          uVar8 = (ulong)uVar1;
          pdVar13 = (double *)((long)&elmat->fElem[lVar12].val_ + local_60);
          if (uVar8 != 0) {
            dVar5 = pdVar13[2];
            if ((ulong)(uint)local_a0.dx_.num_elts == 0) {
              uVar11 = uVar8 * 8;
              if ((int)uVar1 < 0) {
                uVar11 = 0xffffffffffffffff;
              }
              local_a0.dx_.num_elts = uVar1;
              local_a0.dx_.ptr_to_data = (double *)operator_new__(uVar11);
              if (0 < (int)uVar1) {
                uVar11 = 0;
                do {
                  local_a0.dx_.ptr_to_data[uVar11] = *(double *)((long)dVar5 + uVar11 * 8);
                  uVar11 = uVar11 + 1;
                } while (uVar8 != uVar11);
              }
            }
            else if (0 < local_a0.dx_.num_elts) {
              uVar8 = 0;
              do {
                local_a0.dx_.ptr_to_data[uVar8] =
                     *(double *)((long)dVar5 + uVar8 * 8) + local_a0.dx_.ptr_to_data[uVar8];
                uVar8 = uVar8 + 1;
              } while ((uint)local_a0.dx_.num_elts != uVar8);
            }
          }
          local_a0.val_ = *pdVar13 + local_a0.val_;
          (*(local_70->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (local_70,lVar3,lVar9,&local_a0);
          lVar10 = lVar10 + 1;
        } while (lVar10 != lVar2);
        lVar9 = local_68 + 1;
      } while (lVar9 != lVar2);
    }
  }
  else if (0 < lVar2) {
    lVar9 = 0;
    do {
      lVar3 = local_78->fStore[lVar9];
      local_58 = local_80->fStore[lVar9];
      local_60 = local_58 << 5;
      local_68 = lVar9;
      do {
        lVar10 = local_78->fStore[lVar9];
        lVar4 = local_80->fStore[lVar9];
        (*(local_70->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_50,local_70,lVar3);
        local_a0.val_ = local_50.val_;
        Vector<double>::operator=(&local_a0.dx_,&local_50.dx_);
        lVar6 = local_58;
        bVar14 = local_58 < 0;
        local_a0.defaultVal = local_50.defaultVal;
        Fad<double>::~Fad(&local_50);
        lVar12 = (elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
        if (((lVar12 <= lVar6 || bVar14) || (lVar4 < 0)) ||
           ((elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= lVar4)) {
          TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar12 = lVar12 * lVar4;
        uVar1 = *(uint *)((long)&elmat->fElem[lVar12].dx_.num_elts + local_60);
        uVar8 = (ulong)uVar1;
        pdVar13 = (double *)((long)&elmat->fElem[lVar12].val_ + local_60);
        if (uVar8 != 0) {
          dVar5 = pdVar13[2];
          if ((ulong)(uint)local_a0.dx_.num_elts == 0) {
            uVar11 = uVar8 * 8;
            if ((int)uVar1 < 0) {
              uVar11 = 0xffffffffffffffff;
            }
            local_a0.dx_.num_elts = uVar1;
            local_a0.dx_.ptr_to_data = (double *)operator_new__(uVar11);
            if (0 < (int)uVar1) {
              uVar11 = 0;
              do {
                local_a0.dx_.ptr_to_data[uVar11] = *(double *)((long)dVar5 + uVar11 * 8);
                uVar11 = uVar11 + 1;
              } while (uVar8 != uVar11);
            }
          }
          else if (0 < local_a0.dx_.num_elts) {
            uVar8 = 0;
            do {
              local_a0.dx_.ptr_to_data[uVar8] =
                   *(double *)((long)dVar5 + uVar8 * 8) + local_a0.dx_.ptr_to_data[uVar8];
              uVar8 = uVar8 + 1;
            } while ((uint)local_a0.dx_.num_elts != uVar8);
          }
        }
        local_a0.val_ = *pdVar13 + local_a0.val_;
        (*(local_70->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (local_70,lVar3,lVar10,&local_a0);
        lVar9 = lVar9 + 1;
      } while (lVar9 < lVar2);
      lVar9 = local_68 + 1;
    } while (lVar9 != lVar2);
  }
  Fad<double>::~Fad(&local_a0);
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}